

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  uchar *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  quint32 *pqVar5;
  long lVar6;
  
  puVar1 = rasterBuffer->m_buffer;
  uVar3 = QRgba64::toArgb32(color);
  uVar4 = (uVar3 & 0xff00ff) >> 0x10 | (uVar3 & 0xff00ff) << 0x10 | uVar3 & 0xff00ff00;
  uVar2 = rasterBuffer->bytes_per_line;
  pqVar5 = (quint32 *)(puVar1 + (long)y * uVar2 + (long)x * 4);
  lVar6 = (long)width;
  if ((uVar2 & 0xffffffff) == lVar6 * 4) {
    (*qt_memfill32)(pqVar5,uVar4,height * lVar6);
    return;
  }
  if (0 < height) {
    do {
      (*qt_memfill32)(pqVar5,uVar4,lVar6);
      pqVar5 = (quint32 *)((long)pqVar5 + uVar2);
      height = height + -1;
    } while (height != 0);
  }
  return;
}

Assistant:

static void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,
                             int x, int y, int width, int height,
                             const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}